

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phpconvert.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  AppParams *params;
  AppManager *this;
  size_t sVar4;
  ostream *poVar5;
  char *unaff_R15;
  exception ex;
  Bench b;
  undefined *local_98;
  Bench local_90;
  AppParams local_78;
  
  phpconvert::Bench::Bench(&local_90);
  phpconvert::Bench::setStart(&local_90);
  local_98 = &__cxxabiv1::__pointer_type_info::vtable;
  paVar1 = &local_78.path.field_2;
  local_78.path.field_2._8_8_ = 0;
  local_78.recursive = false;
  local_78._33_7_ = 0;
  local_78.outputPath.field_2._8_8_ = 0;
  local_78.valid = false;
  local_78._73_7_ = 0;
  local_78.path._M_string_length = 0;
  local_78.path.field_2._M_allocated_capacity = 0;
  paVar2 = &local_78.outputPath.field_2;
  local_78.outputPath._M_string_length = 0;
  local_78.outputPath.field_2._M_allocated_capacity = 0;
  local_78.path._M_dataplus._M_p = (pointer)paVar1;
  local_78.outputPath._M_dataplus._M_p = (pointer)paVar2;
  params = phpconvert::AppParams::createFromRequest(&local_78,argc,argv);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.outputPath._M_dataplus._M_p != paVar2) {
    operator_delete(local_78.outputPath._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.path._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.path._M_dataplus._M_p);
  }
  this = (AppManager *)operator_new(0x10);
  phpconvert::AppManager::AppManager(this);
  phpconvert::AppManager::run(this,params);
  if (unaff_R15 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1482f8);
  }
  else {
    sVar4 = strlen(unaff_R15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,unaff_R15,sVar4);
  }
  if (params != (AppParams *)0x0) {
    pcVar3 = (params->outputPath)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != &(params->outputPath).field_2) {
      operator_delete(pcVar3);
    }
    pcVar3 = (params->path)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != &(params->path).field_2) {
      operator_delete(pcVar3);
    }
    operator_delete(params);
  }
  (*this->_vptr_AppManager[1])(this);
  phpconvert::Bench::setStop(&local_90);
  phpconvert::Bench::getDiff_abi_cxx11_(&local_78.path,&local_90);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_78.path._M_dataplus._M_p,
                      local_78.path._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.path._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.path._M_dataplus._M_p);
  }
  std::exception::~exception((exception *)&local_98);
  phpconvert::Bench::~Bench(&local_90);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    Bench b;
    b.setStart();

    AppParams *appParams;
    AppManager *app;
    const char* message;
    exception ex;

    appParams = (AppParams()).createFromRequest(argc, argv);
    app = new AppManager();

    try {
        app->run(appParams);
    } catch (SystemException &e) {
        ex = e;
        message =  e.what();
    } catch (exception &e) { //ooopss ;)
        ex = e;
        message =   e.what();
    }

    cout << message;

    delete appParams;
    delete app;
//    delete message;

    b.setStop();
    cout << b.getDiff() << "\n";
    return 0;
}